

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execBitImEa<(moira::Instr)29,(moira::Mode)0,(moira::Size)1>(Moira *this,u16 opcode)

{
  PrefetchQueue PVar1;
  uint uVar2;
  u32 uVar3;
  
  PVar1 = this->queue;
  readExt(this);
  uVar2 = *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  (this->reg).sr.z = (uVar2 >> ((uint)PVar1 & 0x1f) & 1) == 0;
  uVar3 = (this->reg).pc;
  (this->reg).pc0 = uVar3;
  (this->queue).ird = (this->queue).irc;
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
  (this->queue).irc = (u16)uVar3;
  (*this->_vptr_Moira[0x19])(this,(ulong)((uint)(0xf < ((byte)PVar1.irc & 0x1f)) * 2 + 2));
  *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = uVar2 ^ 1 << ((uint)PVar1 & 0x1f);
  return;
}

Assistant:

void
Moira::execBitImEa(u16 opcode)
{
    u8  src = readI<S>();
    int dst = _____________xxx(opcode);

    switch (M)
    {
        case 0:
        {
            src &= 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, src);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(src));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            src &= 0b111;
            u32 ea, data;
            if (!readOp<M,S>(dst, ea, data)) return;

            data = bit<I>(data, src);

            if (I != BTST) {
                prefetch();
                writeM <M, S, POLLIPL> (ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}